

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_write_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_context *ssl_00;
  byte bVar2;
  uchar uVar3;
  size_t sVar4;
  mbedtls_md_info_t *pmVar5;
  mbedtls_pk_context *pmVar6;
  uchar *puVar7;
  uint local_1ac;
  mbedtls_md_info_t *md_info;
  mbedtls_md_context_t ctx;
  mbedtls_sha1_context mbedtls_sha1;
  mbedtls_md5_context mbedtls_md5;
  mbedtls_md_type_t md_alg;
  uchar hash [64];
  uint local_6c;
  size_t sStack_68;
  uint hashlen;
  size_t signature_len;
  mbedtls_ecp_group_id *gid;
  mbedtls_ecp_curve_info **curve;
  size_t len;
  size_t dig_signed_len;
  uchar *dig_signed;
  uchar *p;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  size_t n;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)0x0;
  p = (uchar *)ssl->transform_negotiate->ciphersuite_info;
  dig_signed_len = (size_t)(ssl->out_msg + 4);
  len = 0;
  dig_signed = (uchar *)dig_signed_len;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xa7f,"=> write server key exchange");
  if (((*(int *)(p + 0x18) == 1) || (*(int *)(p + 0x18) == 5)) || (*(int *)(p + 0x18) == 7)) {
    mbedtls_debug_print_msg
              (pmStack_18,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xa88,"<= skip write server key exchange");
    pmStack_18->state = pmStack_18->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if ((*(int *)(p + 0x18) == 9) || (*(int *)(p + 0x18) == 10)) {
    ssl_get_ecdh_params_from_cert(pmStack_18);
    mbedtls_debug_print_msg
              (pmStack_18,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xa95,"<= skip write server key exchange");
    pmStack_18->state = pmStack_18->state + 1;
    ssl_local._4_4_ = 0;
  }
  else {
    if ((*(int *)(p + 0x18) == 6) || (*(int *)(p + 0x18) == 8)) {
      puVar7 = dig_signed + 1;
      *dig_signed = '\0';
      dig_signed = dig_signed + 2;
      *puVar7 = '\0';
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)&ciphersuite_info->id + 2);
    }
    if ((*(int *)(p + 0x18) == 2) || (*(int *)(p + 0x18) == 6)) {
      if (((pmStack_18->conf->dhm_P).p == (mbedtls_mpi_uint *)0x0) ||
         ((pmStack_18->conf->dhm_G).p == (mbedtls_mpi_uint *)0x0)) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xac4,"no DH parameters set");
        return -0x7100;
      }
      n._4_4_ = mbedtls_mpi_copy(&(pmStack_18->handshake->dhm_ctx).P,&pmStack_18->conf->dhm_P);
      if ((n._4_4_ != 0) ||
         (n._4_4_ = mbedtls_mpi_copy(&(pmStack_18->handshake->dhm_ctx).G,&pmStack_18->conf->dhm_G),
         n._4_4_ != 0)) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xad4,"mbedtls_mpi_copy",n._4_4_);
        return n._4_4_;
      }
      pmVar1 = pmStack_18->handshake;
      sVar4 = mbedtls_mpi_size(&(pmStack_18->handshake->dhm_ctx).P);
      n._4_4_ = mbedtls_dhm_make_params
                          (&pmVar1->dhm_ctx,(int)sVar4,dig_signed,(size_t *)&curve,
                           (_func_int_void_ptr_uchar_ptr_size_t *)pmStack_18->conf->f_rng,
                           pmStack_18->conf->p_rng);
      if (n._4_4_ != 0) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xadc,"mbedtls_dhm_make_params",n._4_4_);
        return n._4_4_;
      }
      dig_signed_len = (size_t)dig_signed;
      len = (size_t)curve;
      dig_signed = (uchar *)((long)curve + (long)dig_signed);
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)curve + (long)ciphersuite_info);
      mbedtls_debug_print_mpi
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae6,"DHM: X ",&(pmStack_18->handshake->dhm_ctx).X);
      mbedtls_debug_print_mpi
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae7,"DHM: P ",&(pmStack_18->handshake->dhm_ctx).P);
      mbedtls_debug_print_mpi
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae8,"DHM: G ",&(pmStack_18->handshake->dhm_ctx).G);
      mbedtls_debug_print_mpi
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xae9,"DHM: GX",&(pmStack_18->handshake->dhm_ctx).GX);
    }
    if (((*(int *)(p + 0x18) == 3) || (*(int *)(p + 0x18) == 4)) || (*(int *)(p + 0x18) == 8)) {
      gid = (mbedtls_ecp_group_id *)0x0;
      for (signature_len = (size_t)pmStack_18->conf->curve_list; *(int *)signature_len != 0;
          signature_len = signature_len + 4) {
        for (gid = (mbedtls_ecp_group_id *)pmStack_18->handshake->curves;
            *(undefined8 *)gid != MBEDTLS_ECP_DP_NONE; gid = gid + 2) {
          if (**(int **)gid == *(int *)signature_len) goto LAB_0012abd4;
        }
      }
LAB_0012abd4:
      if ((gid == (mbedtls_ecp_group_id *)0x0) || (*(undefined8 *)gid == MBEDTLS_ECP_DP_NONE)) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb07,"no matching curve for ECDHE");
        return -0x7380;
      }
      mbedtls_debug_print_msg
                (pmStack_18,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb0b,"ECDHE curve: %s",
                 *(undefined8 *)(*(undefined8 *)gid + MBEDTLS_ECP_DP_BP512R1));
      n._4_4_ = mbedtls_ecp_group_load
                          (&(pmStack_18->handshake->ecdh_ctx).grp,**(mbedtls_ecp_group_id **)gid);
      if (n._4_4_ != 0) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb10,"mbedtls_ecp_group_load",n._4_4_);
        return n._4_4_;
      }
      n._4_4_ = mbedtls_ecdh_make_params
                          (&pmStack_18->handshake->ecdh_ctx,(size_t *)&curve,dig_signed,
                           0x4000 - (long)ciphersuite_info,
                           (_func_int_void_ptr_uchar_ptr_size_t *)pmStack_18->conf->f_rng,
                           pmStack_18->conf->p_rng);
      if (n._4_4_ != 0) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb18,"mbedtls_ecdh_make_params",n._4_4_);
        return n._4_4_;
      }
      dig_signed_len = (size_t)dig_signed;
      len = (size_t)curve;
      dig_signed = (uchar *)((long)curve + (long)dig_signed);
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)curve + (long)ciphersuite_info);
      mbedtls_debug_print_ecp
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb22,"ECDH: Q ",&(pmStack_18->handshake->ecdh_ctx).Q);
    }
    if (((*(int *)(p + 0x18) == 2) || (*(int *)(p + 0x18) == 3)) || (*(int *)(p + 0x18) == 4)) {
      sStack_68 = 0;
      mbedtls_md5.buffer[0x38] = '\0';
      mbedtls_md5.buffer[0x39] = '\0';
      mbedtls_md5.buffer[0x3a] = '\0';
      mbedtls_md5.buffer[0x3b] = '\0';
      if (pmStack_18->minor_ver == 3) {
        mbedtls_md5.buffer._56_4_ =
             mbedtls_ssl_md_alg_from_hash((uchar)pmStack_18->handshake->sig_alg);
        if (mbedtls_md5.buffer._56_4_ == MBEDTLS_MD_NONE) {
          mbedtls_debug_print_msg
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xb3c,"should never happen");
          return -0x6c00;
        }
      }
      else if (*(int *)(p + 0x18) == 4) {
        mbedtls_md5.buffer[0x38] = '\x04';
        mbedtls_md5.buffer[0x39] = '\0';
        mbedtls_md5.buffer[0x3a] = '\0';
        mbedtls_md5.buffer[0x3b] = '\0';
      }
      else {
        mbedtls_md5.buffer[0x38] = '\0';
        mbedtls_md5.buffer[0x39] = '\0';
        mbedtls_md5.buffer[0x3a] = '\0';
        mbedtls_md5.buffer[0x3b] = '\0';
      }
      if (mbedtls_md5.buffer._56_4_ == 0) {
        mbedtls_md5_init((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
        mbedtls_sha1_init((mbedtls_sha1_context *)&ctx.hmac_ctx);
        mbedtls_md5_starts((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
        mbedtls_md5_update((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),
                           pmStack_18->handshake->randbytes,0x40);
        mbedtls_md5_update((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),
                           (uchar *)dig_signed_len,len);
        mbedtls_md5_finish((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),
                           mbedtls_md5.buffer + 0x3c);
        mbedtls_sha1_starts((mbedtls_sha1_context *)&ctx.hmac_ctx);
        mbedtls_sha1_update((mbedtls_sha1_context *)&ctx.hmac_ctx,pmStack_18->handshake->randbytes,
                            0x40);
        mbedtls_sha1_update((mbedtls_sha1_context *)&ctx.hmac_ctx,(uchar *)dig_signed_len,len);
        mbedtls_sha1_finish((mbedtls_sha1_context *)&ctx.hmac_ctx,hash + 8);
        local_6c = 0x24;
        mbedtls_md5_free((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
        mbedtls_sha1_free((mbedtls_sha1_context *)&ctx.hmac_ctx);
      }
      else {
        if (mbedtls_md5.buffer._56_4_ == 0) {
          mbedtls_debug_print_msg
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xb9e,"should never happen");
          return -0x6c00;
        }
        pmVar5 = mbedtls_md_info_from_type(mbedtls_md5.buffer._56_4_);
        mbedtls_md_init((mbedtls_md_context_t *)&md_info);
        local_6c = 0;
        n._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)&md_info,pmVar5,0);
        if (n._4_4_ != 0) {
          mbedtls_debug_print_ret
                    (pmStack_18,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xb90,"mbedtls_md_setup",n._4_4_);
          return n._4_4_;
        }
        mbedtls_md_starts((mbedtls_md_context_t *)&md_info);
        mbedtls_md_update((mbedtls_md_context_t *)&md_info,pmStack_18->handshake->randbytes,0x40);
        mbedtls_md_update((mbedtls_md_context_t *)&md_info,(uchar *)dig_signed_len,len);
        mbedtls_md_finish((mbedtls_md_context_t *)&md_info,mbedtls_md5.buffer + 0x3c);
        mbedtls_md_free((mbedtls_md_context_t *)&md_info);
      }
      ssl_00 = pmStack_18;
      if (local_6c == 0) {
        pmVar5 = mbedtls_md_info_from_type(mbedtls_md5.buffer._56_4_);
        bVar2 = mbedtls_md_get_size(pmVar5);
        local_1ac = (uint)bVar2;
      }
      else {
        local_1ac = local_6c;
      }
      mbedtls_debug_print_buf
                (ssl_00,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xba3,"parameters hash",mbedtls_md5.buffer + 0x3c,(ulong)local_1ac);
      pmVar6 = mbedtls_ssl_own_key(pmStack_18);
      if (pmVar6 == (mbedtls_pk_context *)0x0) {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xbaa,"got no private key");
        return -0x7600;
      }
      if (pmStack_18->minor_ver == 3) {
        *dig_signed = (uchar)pmStack_18->handshake->sig_alg;
        dig_signed = dig_signed + 1;
        pmVar6 = mbedtls_ssl_own_key(pmStack_18);
        uVar3 = mbedtls_ssl_sig_from_pk(pmVar6);
        *dig_signed = uVar3;
        ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)&ciphersuite_info->id + 2);
        dig_signed = dig_signed + 1;
      }
      pmVar6 = mbedtls_ssl_own_key(pmStack_18);
      n._4_4_ = mbedtls_pk_sign(pmVar6,mbedtls_md5.buffer._56_4_,mbedtls_md5.buffer + 0x3c,
                                (ulong)local_6c,dig_signed + 2,&stack0xffffffffffffff98,
                                (_func_int_void_ptr_uchar_ptr_size_t *)pmStack_18->conf->f_rng,
                                pmStack_18->conf->p_rng);
      if (n._4_4_ != 0) {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xbbc,"mbedtls_pk_sign",n._4_4_);
        return n._4_4_;
      }
      puVar7 = dig_signed + 1;
      *dig_signed = (uchar)(sStack_68 >> 8);
      dig_signed = dig_signed + 2;
      *puVar7 = (uchar)sStack_68;
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)&ciphersuite_info->id + 2);
      mbedtls_debug_print_buf
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xbc4,"my signature",dig_signed,sStack_68);
      ciphersuite_info = (mbedtls_ssl_ciphersuite_t *)((long)&ciphersuite_info->id + sStack_68);
    }
    pmStack_18->out_msglen = (size_t)&ciphersuite_info->field_0x4;
    pmStack_18->out_msgtype = 0x16;
    *pmStack_18->out_msg = '\f';
    pmStack_18->state = pmStack_18->state + 1;
    n._4_4_ = mbedtls_ssl_write_record(pmStack_18);
    if (n._4_4_ == 0) {
      mbedtls_debug_print_msg
                (pmStack_18,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xbd8,"<= write server key exchange");
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xbd4,"mbedtls_ssl_write_record",n._4_4_);
      ssl_local._4_4_ = n._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t n = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
                            ssl->transform_negotiate->ciphersuite_info;

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    unsigned char *p = ssl->out_msg + 4;
    unsigned char *dig_signed = p;
    size_t dig_signed_len = 0, len;
    ((void) dig_signed);
    ((void) dig_signed_len);
    ((void) len);
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        ssl_get_ecdh_params_from_cert( ssl );

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        size_t jlen;
        const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;

        ret = mbedtls_ecjpake_write_round_two( &ssl->handshake->ecjpake_ctx,
                p, end - p, &jlen, ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_write_round_two", ret );
            return( ret );
        }

        p += jlen;
        n += jlen;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /* Note: we don't support identity hints, until someone asks
         * for them. */
        *(p++) = 0x00;
        *(p++) = 0x00;

        n += 2;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl->conf->dhm_P.p == NULL || ssl->conf->dhm_G.p == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no DH parameters set" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * Ephemeral DH parameters:
         *
         * struct {
         *     opaque dh_p<1..2^16-1>;
         *     opaque dh_g<1..2^16-1>;
         *     opaque dh_Ys<1..2^16-1>;
         * } ServerDHParams;
         */
        if( ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.P, &ssl->conf->dhm_P ) ) != 0 ||
            ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.G, &ssl->conf->dhm_G ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_mpi_copy", ret );
            return( ret );
        }

        if( ( ret = mbedtls_dhm_make_params( &ssl->handshake->dhm_ctx,
                        (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                        p, &len, ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: P ", &ssl->handshake->dhm_ctx.P  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: G ", &ssl->handshake->dhm_ctx.G  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /*
         * Ephemeral ECDH parameters:
         *
         * struct {
         *     ECParameters curve_params;
         *     ECPoint      public;
         * } ServerECDHParams;
         */
        const mbedtls_ecp_curve_info **curve = NULL;
        const mbedtls_ecp_group_id *gid;

        /* Match our preference list against the offered curves */
        for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
            for( curve = ssl->handshake->curves; *curve != NULL; curve++ )
                if( (*curve)->grp_id == *gid )
                    goto curve_matching_done;

curve_matching_done:
        if( curve == NULL || *curve == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no matching curve for ECDHE" ) );
            return( MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDHE curve: %s", (*curve)->name ) );

        if( ( ret = mbedtls_ecp_group_load( &ssl->handshake->ecdh_ctx.grp,
                                       (*curve)->grp_id ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecp_group_load", ret );
            return( ret );
        }

        if( ( ret = mbedtls_ecdh_make_params( &ssl->handshake->ecdh_ctx, &len,
                                      p, MBEDTLS_SSL_MAX_CONTENT_LEN - n,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q ", &ssl->handshake->ecdh_ctx.Q );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t signature_len = 0;
        unsigned int hashlen = 0;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;

        /*
         * Choose hash algorithm. NONE means MD5 + SHA1 here.
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            md_alg = mbedtls_ssl_md_alg_from_hash( ssl->handshake->sig_alg );

            if( md_alg == MBEDTLS_MD_NONE )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ciphersuite_info->key_exchange ==
                  MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
        {
            md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            md_alg = MBEDTLS_MD_NONE;
        }

        /*
         * Compute the hash to be signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes,  64 );
            mbedtls_md5_update( &mbedtls_md5, dig_signed, dig_signed_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes,  64 );
            mbedtls_sha1_update( &mbedtls_sha1, dig_signed, dig_signed_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            hashlen = 36;

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;
            const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, dig_signed, dig_signed_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        /*
         * Make the signature
         */
        if( mbedtls_ssl_own_key( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            *(p++) = ssl->handshake->sig_alg;
            *(p++) = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

            n += 2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash, hashlen,
                        p + 2 , &signature_len,
                        ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( signature_len >> 8 );
        *(p++) = (unsigned char)( signature_len      );
        n += 2;

        MBEDTLS_SSL_DEBUG_BUF( 3, "my signature", p, signature_len );

        n += signature_len;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

    ssl->out_msglen  = 4 + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server key exchange" ) );

    return( 0 );
}